

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *cp)

{
  void *pvVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  long lVar9;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[3];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018cc160;
  iVar2 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[1];
  iVar3 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[2];
  iVar4 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[3];
  iVar5 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[4];
  iVar6 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[5];
  iVar7 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[6];
  iVar8 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[7];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] = iVar2;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] = iVar3;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] = iVar4;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[4] = iVar5;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[5] = iVar6;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[6] = iVar7;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes[7] = iVar8;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticQuad_018cc0d8;
  lVar9 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar9) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar9) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar9) = 0xffffffffffffffff;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xd8);
  lVar9 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar9) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar9);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar9) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar9);
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xd8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}